

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_smod(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint uVar1;
  BtorSimBitVector *bv;
  ulong uVar2;
  BtorSimBitVector *pBVar3;
  BtorSimBitVector *pBVar4;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *__ptr_00;
  BtorSimBitVector *__ptr_01;
  BtorSimBitVector *__ptr_02;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_00;
  ulong uVar5;
  BtorSimBitVector *b_01;
  uint32_t uVar6;
  ulong uVar7;
  BtorSimBitVector *res_1;
  byte bVar8;
  BtorSimBitVector *__src;
  byte bVar9;
  bool bVar10;
  BtorSimBitVector *res;
  BtorSimBitVector *local_38;
  
  if (a->width == 1) {
    pBVar3 = btorsim_bv_not(b);
    pBVar4 = btorsim_bv_and(a,pBVar3);
    goto LAB_0011586a;
  }
  uVar6 = a->width - 1;
  __ptr = btorsim_bv_slice(a,uVar6,uVar6);
  uVar6 = b->width - 1;
  __ptr_00 = btorsim_bv_slice(b,uVar6,uVar6);
  if (__ptr->width == 1) {
    bVar9 = (byte)(&__ptr[1].width)[__ptr->len - 1] & 1;
  }
  else {
    bVar9 = 0;
  }
  if (__ptr_00->width == 1) {
    bVar8 = (byte)(&__ptr_00[1].width)[__ptr_00->len - 1] & 1;
  }
  else {
    bVar8 = 0;
  }
  __ptr_01 = btorsim_bv_neg(a);
  __ptr_02 = btorsim_bv_neg(b);
  if (bVar9 != 0) {
    a = __ptr_01;
  }
  a_00 = btorsim_bv_new(a->width);
  memcpy(a_00 + 1,a + 1,(ulong)a->len << 2);
  pBVar3 = b;
  if (bVar8 != 0) {
    pBVar3 = __ptr_02;
  }
  b_00 = btorsim_bv_new(pBVar3->width);
  memcpy(b_00 + 1,pBVar3 + 1,(ulong)pBVar3->len << 2);
  local_38 = (BtorSimBitVector *)0x0;
  udiv_urem_bv(a_00,b_00,(BtorSimBitVector **)0x0,&local_38);
  bv = local_38;
  __src = local_38 + 1;
  uVar5 = (ulong)local_38->len;
  bVar10 = uVar5 == 0;
  if ((!bVar10) && (__src->width == 0)) {
    uVar2 = 1;
    do {
      uVar7 = uVar2;
      if (uVar5 == uVar7) break;
      uVar2 = uVar7 + 1;
    } while ((&local_38[1].width)[uVar7] == 0);
    bVar10 = uVar5 <= uVar7;
  }
  b_01 = btorsim_bv_new(b->width);
  if (!bVar10) {
    memcpy(b_01 + 1,b + 1,(ulong)b->len << 2);
  }
  pBVar3 = btorsim_bv_neg(bv);
  if (bVar9 == 0 && bVar8 == 0) {
    pBVar4 = btorsim_bv_new(bv->width);
    uVar1 = bv->len;
LAB_001157f9:
    memcpy(pBVar4 + 1,__src,(ulong)uVar1 << 2);
  }
  else {
    pBVar4 = pBVar3;
    if (((~bVar9 & 1) != 0 || bVar8 != 0) && (pBVar4 = bv, bVar9 != 0 || (~bVar8 & 1) != 0)) {
      pBVar4 = btorsim_bv_new(pBVar3->width);
      __src = pBVar3 + 1;
      uVar1 = pBVar3->len;
      goto LAB_001157f9;
    }
    pBVar4 = btorsim_bv_add(pBVar4,b_01);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(a_00);
  free(b_00);
  free(bv);
  free(b_01);
LAB_0011586a:
  free(pBVar3);
  return pBVar4;
}

Assistant:

BtorSimBitVector *
btorsim_bv_smod (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_b, *sign_a, *sign_b, *neg_a, *neg_b, *add;
  BtorSimBitVector *cond_a, *cond_b, *urem, *neg_urem;
  bool a_positive, b_positive;

  if (a->width == 1)
  {
    not_b = btorsim_bv_not (b);
    res   = btorsim_bv_and (a, not_b);
    btorsim_bv_free (not_b);
  }
  else
  {
    sign_a = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    a_positive = !btorsim_bv_is_true (sign_a);
    b_positive = !btorsim_bv_is_true (sign_b);

    neg_a  = btorsim_bv_neg (a);
    neg_b  = btorsim_bv_neg (b);
    cond_a = a_positive ? btorsim_bv_copy (a)
                        : btorsim_bv_copy (neg_a);
    cond_b = b_positive ? btorsim_bv_copy (b)
                        : btorsim_bv_copy (neg_b);


    urem     = btorsim_bv_urem (cond_a, cond_b);
    add = btorsim_bv_is_zero(urem) ? btorsim_bv_zero(b->width)
                                   : btorsim_bv_copy(b);

    neg_urem = btorsim_bv_neg (urem);

    res =  a_positive &&  b_positive ? btorsim_bv_copy(urem)
        : !a_positive &&  b_positive ? btorsim_bv_add(neg_urem, add)
        :  a_positive && !b_positive ? btorsim_bv_add(urem, add)
                                     : btorsim_bv_copy(neg_urem);

    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (urem);
    btorsim_bv_free (add);
    btorsim_bv_free (neg_urem);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}